

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UBool icu_63::TimeZone::parseCustomID
                (UnicodeString *id,int32_t *sign,int32_t *hour,int32_t *min,int32_t *sec)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  bool bVar7;
  int32_t length;
  int32_t oldPos;
  Formattable n;
  UErrorCode local_198;
  int32_t start;
  UErrorCode success;
  ParsePosition pos;
  ConstChar16Ptr local_178 [3];
  Locale local_160;
  undefined1 local_80 [8];
  UnicodeString idUppercase;
  NumberFormat *numberFormat;
  int32_t *sec_local;
  int32_t *min_local;
  int32_t *hour_local;
  int32_t *sign_local;
  UnicodeString *id_local;
  
  idUppercase.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_80,id);
  Locale::Locale(&local_160,"",(char *)0x0,(char *)0x0,(char *)0x0);
  UnicodeString::toUpper((UnicodeString *)local_80,&local_160);
  Locale::~Locale(&local_160);
  pos.errorIndex._3_1_ = 0;
  iVar3 = UnicodeString::length(id);
  bVar7 = false;
  if (3 < iVar3) {
    ConstChar16Ptr::ConstChar16Ptr(local_178,L"GMT");
    pos.errorIndex._3_1_ = 1;
    UVar1 = UnicodeString::startsWith((UnicodeString *)local_80,local_178,3);
    bVar7 = UVar1 != '\0';
  }
  if ((pos.errorIndex._3_1_ & 1) != 0) {
    ConstChar16Ptr::~ConstChar16Ptr(local_178);
  }
  if (!bVar7) {
    id_local._7_1_ = '\0';
    start = 1;
    goto LAB_00242f57;
  }
  ParsePosition::ParsePosition((ParsePosition *)&success,3);
  *sign = 1;
  *hour = 0;
  *min = 0;
  *sec = 0;
  iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
  cVar2 = UnicodeString::operator[](id,iVar3);
  if (cVar2 == L'-') {
    *sign = -1;
LAB_0024285d:
    iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
    ParsePosition::setIndex((ParsePosition *)&success,iVar3 + 1);
    local_198 = U_ZERO_ERROR;
    idUppercase.fUnion._48_8_ = NumberFormat::createInstance(&local_198);
    UVar1 = ::U_FAILURE(local_198);
    if (UVar1 == '\0') {
      (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 0xb8))(idUppercase.fUnion._48_8_,1);
      n.fBogus.fUnion._52_4_ = ParsePosition::getIndex((ParsePosition *)&success);
      Formattable::Formattable((Formattable *)&length,-99999);
      (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 0xa0))
                (idUppercase.fUnion._48_8_,id,&length,&success);
      iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
      if (iVar3 == n.fBogus.fUnion._52_4_) {
        if (idUppercase.fUnion._48_8_ != 0) {
          (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
        }
        id_local._7_1_ = '\0';
      }
      else {
        iVar3 = Formattable::getLong((Formattable *)&length);
        *hour = iVar3;
        iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
        iVar4 = UnicodeString::length(id);
        if (iVar3 < iVar4) {
          iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
          if (iVar3 - n.fBogus.fUnion._52_4_ < 3) {
            iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
            cVar2 = UnicodeString::operator[](id,iVar3);
            if (cVar2 == L':') {
              iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
              ParsePosition::setIndex((ParsePosition *)&success,iVar3 + 1);
              iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
              Formattable::setLong((Formattable *)&length,-99999);
              (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 0xa0))
                        (idUppercase.fUnion._48_8_,id,&length,&success);
              iVar4 = ParsePosition::getIndex((ParsePosition *)&success);
              if (iVar4 - iVar3 == 2) {
                iVar3 = Formattable::getLong((Formattable *)&length);
                *min = iVar3;
                iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
                iVar4 = UnicodeString::length(id);
                if (iVar3 < iVar4) {
                  iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
                  cVar2 = UnicodeString::operator[](id,iVar3);
                  if (cVar2 == L':') {
                    iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
                    ParsePosition::setIndex((ParsePosition *)&success,iVar3 + 1);
                    iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
                    Formattable::setLong((Formattable *)&length,-99999);
                    (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 0xa0))
                              (idUppercase.fUnion._48_8_,id,&length,&success);
                    iVar4 = ParsePosition::getIndex((ParsePosition *)&success);
                    iVar5 = UnicodeString::length(id);
                    if ((iVar4 == iVar5) &&
                       (iVar4 = ParsePosition::getIndex((ParsePosition *)&success),
                       iVar4 - iVar3 == 2)) {
                      iVar3 = Formattable::getLong((Formattable *)&length);
                      *sec = iVar3;
                      goto LAB_00242eca;
                    }
                    if (idUppercase.fUnion._48_8_ != 0) {
                      (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
                    }
                    id_local._7_1_ = '\0';
                  }
                  else {
                    if (idUppercase.fUnion._48_8_ != 0) {
                      (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
                    }
                    id_local._7_1_ = '\0';
                  }
                }
                else {
LAB_00242eca:
                  if (idUppercase.fUnion._48_8_ != 0) {
                    (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
                  }
                  if (((*hour < 0x18) && (*min < 0x3c)) && (*sec < 0x3c)) {
                    id_local._7_1_ = '\x01';
                  }
                  else {
                    id_local._7_1_ = '\0';
                  }
                }
              }
              else {
                if (idUppercase.fUnion._48_8_ != 0) {
                  (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
                }
                id_local._7_1_ = '\0';
              }
              goto LAB_00242f21;
            }
          }
          if (idUppercase.fUnion._48_8_ != 0) {
            (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
          }
          id_local._7_1_ = '\0';
        }
        else {
          iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
          iVar6 = iVar3 - n.fBogus.fUnion._52_4_;
          if ((0 < iVar6) && (iVar6 < 7)) {
            if (1 < iVar6 - 1U) {
              if (iVar6 - 3U < 2) {
                *min = *hour % 100;
                *hour = *hour / 100;
              }
              else if (iVar6 - 5U < 2) {
                *sec = *hour % 100;
                *min = (int32_t)((long)((ulong)(uint)((int)((long)*hour / 100) >> 0x1f) << 0x20 |
                                       (long)*hour / 100 & 0xffffffffU) % 100);
                *hour = *hour / 10000;
              }
            }
            goto LAB_00242eca;
          }
          if (idUppercase.fUnion._48_8_ != 0) {
            (**(code **)(*(long *)idUppercase.fUnion._48_8_ + 8))();
          }
          id_local._7_1_ = '\0';
        }
      }
LAB_00242f21:
      start = 1;
      Formattable::~Formattable((Formattable *)&length);
    }
    else {
      id_local._7_1_ = '\0';
      start = 1;
    }
  }
  else {
    iVar3 = ParsePosition::getIndex((ParsePosition *)&success);
    cVar2 = UnicodeString::operator[](id,iVar3);
    if (cVar2 == L'+') goto LAB_0024285d;
    id_local._7_1_ = '\0';
    start = 1;
  }
  ParsePosition::~ParsePosition((ParsePosition *)&success);
LAB_00242f57:
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return id_local._7_1_;
}

Assistant:

UBool
TimeZone::parseCustomID(const UnicodeString& id, int32_t& sign,
                        int32_t& hour, int32_t& min, int32_t& sec) {
    static const int32_t         kParseFailed = -99999;

    NumberFormat* numberFormat = 0;
    UnicodeString idUppercase = id;
    idUppercase.toUpper("");

    if (id.length() > GMT_ID_LENGTH &&
        idUppercase.startsWith(GMT_ID, GMT_ID_LENGTH))
    {
        ParsePosition pos(GMT_ID_LENGTH);
        sign = 1;
        hour = 0;
        min = 0;
        sec = 0;

        if (id[pos.getIndex()] == MINUS /*'-'*/) {
            sign = -1;
        } else if (id[pos.getIndex()] != PLUS /*'+'*/) {
            return FALSE;
        }
        pos.setIndex(pos.getIndex() + 1);

        UErrorCode success = U_ZERO_ERROR;
        numberFormat = NumberFormat::createInstance(success);
        if(U_FAILURE(success)){
            return FALSE;
        }
        numberFormat->setParseIntegerOnly(TRUE);
        //numberFormat->setLenient(TRUE); // TODO: May need to set this, depends on latest timezone parsing

        // Look for either hh:mm, hhmm, or hh
        int32_t start = pos.getIndex();
        Formattable n(kParseFailed);
        numberFormat->parse(id, n, pos);
        if (pos.getIndex() == start) {
            delete numberFormat;
            return FALSE;
        }
        hour = n.getLong();

        if (pos.getIndex() < id.length()) {
            if (pos.getIndex() - start > 2
                || id[pos.getIndex()] != COLON) {
                delete numberFormat;
                return FALSE;
            }
            // hh:mm
            pos.setIndex(pos.getIndex() + 1);
            int32_t oldPos = pos.getIndex();
            n.setLong(kParseFailed);
            numberFormat->parse(id, n, pos);
            if ((pos.getIndex() - oldPos) != 2) {
                // must be 2 digits
                delete numberFormat;
                return FALSE;
            }
            min = n.getLong();
            if (pos.getIndex() < id.length()) {
                if (id[pos.getIndex()] != COLON) {
                    delete numberFormat;
                    return FALSE;
                }
                // [:ss]
                pos.setIndex(pos.getIndex() + 1);
                oldPos = pos.getIndex();
                n.setLong(kParseFailed);
                numberFormat->parse(id, n, pos);
                if (pos.getIndex() != id.length()
                        || (pos.getIndex() - oldPos) != 2) {
                    delete numberFormat;
                    return FALSE;
                }
                sec = n.getLong();
            }
        } else {
            // Supported formats are below -
            //
            // HHmmss
            // Hmmss
            // HHmm
            // Hmm
            // HH
            // H

            int32_t length = pos.getIndex() - start;
            if (length <= 0 || 6 < length) {
                // invalid length
                delete numberFormat;
                return FALSE;
            }
            switch (length) {
                case 1:
                case 2:
                    // already set to hour
                    break;
                case 3:
                case 4:
                    min = hour % 100;
                    hour /= 100;
                    break;
                case 5:
                case 6:
                    sec = hour % 100;
                    min = (hour/100) % 100;
                    hour /= 10000;
                    break;
            }
        }

        delete numberFormat;

        if (hour > kMAX_CUSTOM_HOUR || min > kMAX_CUSTOM_MIN || sec > kMAX_CUSTOM_SEC) {
            return FALSE;
        }
        return TRUE;
    }
    return FALSE;
}